

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_rawsetp(lua_State *L,int idx,void *p)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  TValue *io;
  TValue k;
  Value local_28;
  undefined4 local_20;
  
  pTVar4 = index2addr(L,idx);
  local_20 = 2;
  local_28.p = p;
  pTVar5 = luaH_set(L,(Table *)(pTVar4->value_).gc,(TValue *)&local_28);
  pTVar1 = L->top;
  iVar2 = pTVar1[-1].tt_;
  uVar3 = *(undefined4 *)&pTVar1[-1].field_0xc;
  pTVar5->value_ = pTVar1[-1].value_;
  pTVar5->tt_ = iVar2;
  *(undefined4 *)&pTVar5->field_0xc = uVar3;
  if ((((L->top[-1].tt_ & 0x40) != 0) && ((((Table *)(pTVar4->value_).gc)->marked & 4) != 0)) &&
     (((L->top[-1].value_.gc)->marked & 3) != 0)) {
    luaC_barrierback_(L,(Table *)(pTVar4->value_).gc);
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_rawsetp (lua_State *L, int idx, const void *p) {
  StkId o;
  TValue k, *slot;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2addr(L, idx);
  api_check(L, ttistable(o), "table expected");
  setpvalue(&k, cast(void *, p));
  slot = luaH_set(L, hvalue(o), &k);
  setobj2t(L, slot, L->top - 1);
  luaC_barrierback(L, hvalue(o), L->top - 1);
  L->top--;
  lua_unlock(L);
}